

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<bool> __thiscall
kj::HttpServer::listenHttpImpl(HttpServer *this,AsyncIoStream *connection,bool wantCleanDrain)

{
  bool bVar1;
  Tag TVar2;
  AsyncIoStream *params;
  Own<kj::HttpService,_std::nullptr_t> *other;
  byte in_CL;
  undefined7 in_register_00000011;
  Maybe<kj::HttpServer::SuspendedRequest> local_1a8;
  Own<kj::HttpService,_std::nullptr_t> local_f8;
  undefined1 local_e8 [24];
  Fault f;
  HttpService *local_c8;
  DebugExpression<kj::HttpService*> local_c0 [8];
  undefined1 local_b8 [8];
  DebugComparison<kj::HttpService_*,_std::nullptr_t> _kjCondition;
  undefined8 local_80;
  Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)> *_kj_switch_done_1;
  Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)> *func;
  undefined8 local_60;
  HttpService **_kj_switch_done;
  HttpService **ptr;
  undefined8 local_40;
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
  *_kj_switch_subject;
  Own<kj::HttpService,_std::nullptr_t> srv;
  bool wantCleanDrain_local;
  AsyncIoStream *connection_local;
  HttpServer *this_local;
  
  srv.ptr._7_1_ = in_CL & 1;
  Own<kj::HttpService,_std::nullptr_t>::Own
            ((Own<kj::HttpService,_std::nullptr_t> *)&_kj_switch_subject);
  local_40 = OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
             ::_switchSubject((OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
                               *)&connection[1].super_AsyncOutputStream);
  TVar2 = OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
          ::which((OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
                   *)local_40);
  if (TVar2 == _variant0) {
    local_60 = OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
               ::get<kj::HttpService*>
                         ((OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
                           *)local_40);
    _kj_switch_done = (HttpService **)local_60;
    while ((ArrayDisposer *)local_60 != (ArrayDisposer *)0x0) {
      Own<kj::HttpService,_std::nullptr_t>::Own
                ((Own<kj::HttpService,_std::nullptr_t> *)&func,*_kj_switch_done,
                 (Disposer *)&NullDisposer::instance);
      Own<kj::HttpService,_std::nullptr_t>::operator=
                ((Own<kj::HttpService,_std::nullptr_t> *)&_kj_switch_subject,
                 (Own<kj::HttpService,_std::nullptr_t> *)&func);
      Own<kj::HttpService,_std::nullptr_t>::~Own((Own<kj::HttpService,_std::nullptr_t> *)&func);
      local_60 = (ArrayDisposer *)0x0;
    }
  }
  else if (TVar2 == _variant1) {
    params = (AsyncIoStream *)
             OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
             ::get<kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
                       ((OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
                         *)local_40);
    local_80 = params;
    while ((AsyncIoStream *)local_80 != (AsyncIoStream *)0x0) {
      Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>::operator()
                ((Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)> *)
                 &_kjCondition.result,params);
      Own<kj::HttpService,_std::nullptr_t>::operator=
                ((Own<kj::HttpService,_std::nullptr_t> *)&_kj_switch_subject,
                 (Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition.result);
      Own<kj::HttpService,_std::nullptr_t>::~Own
                ((Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition.result);
      local_80 = (AsyncIoStream *)0x0;
    }
  }
  local_c8 = Own<kj::HttpService,_std::nullptr_t>::get
                       ((Own<kj::HttpService,_std::nullptr_t> *)&_kj_switch_subject);
  local_c0 = (DebugExpression<kj::HttpService*>  [8])
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::HttpService*>::operator!=
            ((DebugComparison<kj::HttpService_*,_std::nullptr_t> *)local_b8,local_c0,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (bVar1) {
    other = mv<kj::Own<kj::HttpService,decltype(nullptr)>>
                      ((Own<kj::HttpService,_std::nullptr_t> *)&_kj_switch_subject);
    Own<kj::HttpService,_std::nullptr_t>::Own(&local_f8,other);
    Function<kj::Maybe<kj::Own<kj::HttpService,decltype(nullptr)>>(kj::HttpServer::SuspendableRequest&)>
    ::Function<kj::HttpServer::listenHttpImpl(kj::AsyncIoStream&,bool)::__0>
              ((Function<kj::Maybe<kj::Own<kj::HttpService,decltype(nullptr)>>(kj::HttpServer::SuspendableRequest&)>
                *)local_e8,(Type *)&local_f8);
    Maybe<kj::HttpServer::SuspendedRequest>::Maybe(&local_1a8);
    listenHttpImpl(this,connection,
                   (SuspendableHttpServiceFactory *)CONCAT71(in_register_00000011,wantCleanDrain),
                   (Maybe<kj::HttpServer::SuspendedRequest> *)local_e8,SUB81(&local_1a8,0));
    Maybe<kj::HttpServer::SuspendedRequest>::~Maybe(&local_1a8);
    Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
    ::~Function((Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
                 *)local_e8);
    listenHttpImpl(kj::AsyncIoStream&,bool)::$_0::~__0((__0 *)&local_f8);
    Own<kj::HttpService,_std::nullptr_t>::~Own
              ((Own<kj::HttpService,_std::nullptr_t> *)&_kj_switch_subject);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::HttpService*,decltype(nullptr)>&>
            ((Fault *)(local_e8 + 0x10),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fff,FAILED,"srv.get() != nullptr","_kjCondition,",
             (DebugComparison<kj::HttpService_*,_std::nullptr_t> *)local_b8);
  kj::_::Debug::Fault::fatal((Fault *)(local_e8 + 0x10));
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpImpl(kj::AsyncIoStream& connection, bool wantCleanDrain) {
  kj::Own<HttpService> srv;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      // Fake Own okay because we can assume the HttpService outlives this HttpServer, and we can
      // assume `this` HttpServer outlives the returned `listenHttpCleanDrain()` promise, which will
      // own the fake Own.
      srv = kj::Own<HttpService>(ptr, kj::NullDisposer::instance);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      srv = func(connection);
    }
  }

  KJ_ASSERT(srv.get() != nullptr);

  return listenHttpImpl(connection, [srv = kj::mv(srv)](SuspendableRequest&) mutable {
    // This factory function will be owned by the Connection object, meaning the Connection object
    // will own the HttpService. We also know that the Connection object outlives all
    // service.request() promises (service.request() is called from a Connection member function).
    // The Owns we return from this function are attached to the service.request() promises,
    // meaning this factory function will outlive all Owns we return. So, it's safe to return a fake
    // Own.
    return kj::Own<HttpService>(srv.get(), kj::NullDisposer::instance);
  }, kj::none /* suspendedRequest */, wantCleanDrain);
}